

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O2

void __thiscall jessilib::impl::parser_manager::parser_manager(parser_manager *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_69;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<jessilib::parser> local_58;
  string local_40;
  
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_registrations)._M_t._M_impl.super__Rb_tree_header;
  (this->m_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x30) = 0;
  this->m_last_id = 0;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_parsers)._M_h._M_buckets = &(this->m_parsers)._M_h._M_single_bucket;
  (this->m_parsers)._M_h._M_bucket_count = 1;
  (this->m_parsers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_parsers)._M_h._M_element_count = 0;
  (this->m_parsers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_parsers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_parsers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::make_shared<jessilib::json_parser>();
  local_58.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_58.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_60._M_pi;
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"json",&local_69);
  register_parser(this,&local_58,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  return;
}

Assistant:

parser_manager::parser_manager() {
	// Add library-provided default parsers; intentionally delayed until construction rather than self-registration for zero-cost static initialization when unused
	register_parser(std::make_shared<json_parser>(), "json", false);
}